

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::Symbol>::emplace<QCss::Symbol_const&>
          (QMovableArrayOps<QCss::Symbol> *this,qsizetype i,Symbol *args)

{
  Symbol **ppSVar1;
  Symbol *pSVar2;
  TokenType TVar3;
  undefined4 uVar4;
  Data *pDVar5;
  Symbol *pSVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  undefined4 uVar10;
  int iVar11;
  qsizetype *pqVar12;
  bool bVar13;
  
  pDVar5 = (this->super_QGenericArrayOps<QCss::Symbol>).super_QArrayDataPointer<QCss::Symbol>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_005e8f95:
    TVar3 = args->token;
    pDVar7 = (args->text).d.d;
    pcVar8 = (args->text).d.ptr;
    qVar9 = (args->text).d.size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    uVar4 = args->start;
    uVar10 = args->len;
    bVar13 = (this->super_QGenericArrayOps<QCss::Symbol>).super_QArrayDataPointer<QCss::Symbol>.size
             != 0;
    QArrayDataPointer<QCss::Symbol>::detachAndGrow
              ((QArrayDataPointer<QCss::Symbol> *)this,(uint)(i == 0 && bVar13),1,(Symbol **)0x0,
               (QArrayDataPointer<QCss::Symbol> *)0x0);
    pSVar6 = (this->super_QGenericArrayOps<QCss::Symbol>).super_QArrayDataPointer<QCss::Symbol>.ptr;
    if (i != 0 || !bVar13) {
      pSVar2 = pSVar6 + i;
      memmove(pSVar2 + 1,pSVar6 + i,
              ((this->super_QGenericArrayOps<QCss::Symbol>).super_QArrayDataPointer<QCss::Symbol>.
               size - i) * 0x28);
      pSVar2->token = TVar3;
      (pSVar2->text).d.d = pDVar7;
      (pSVar2->text).d.ptr = pcVar8;
      (pSVar2->text).d.size = qVar9;
      pSVar2->start = uVar4;
      pSVar2->len = uVar10;
      goto LAB_005e9063;
    }
    pSVar6[-1].token = TVar3;
    pSVar6[-1].text.d.d = pDVar7;
    pSVar6[-1].text.d.ptr = pcVar8;
    pSVar6[-1].text.d.size = qVar9;
    pSVar6[-1].start = uVar4;
    pSVar6[-1].len = uVar10;
  }
  else {
    if (((this->super_QGenericArrayOps<QCss::Symbol>).super_QArrayDataPointer<QCss::Symbol>.size ==
         i) && (pSVar6 = (this->super_QGenericArrayOps<QCss::Symbol>).
                         super_QArrayDataPointer<QCss::Symbol>.ptr,
               (pDVar5->super_QArrayData).alloc - i !=
               ((long)((long)pSVar6 -
                      ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) * -0x3333333333333333)) {
      pSVar6 = pSVar6 + i;
      pSVar6->token = args->token;
      pDVar7 = (args->text).d.d;
      (pSVar6->text).d.d = pDVar7;
      (pSVar6->text).d.ptr = (args->text).d.ptr;
      (pSVar6->text).d.size = (args->text).d.size;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar11 = args->len;
      pSVar6->start = args->start;
      pSVar6->len = iVar11;
      goto LAB_005e9063;
    }
    if ((i != 0) ||
       (pSVar6 = (this->super_QGenericArrayOps<QCss::Symbol>).super_QArrayDataPointer<QCss::Symbol>.
                 ptr,
       (Symbol *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
       pSVar6)) goto LAB_005e8f95;
    pSVar6[-1].token = args->token;
    pDVar7 = (args->text).d.d;
    pSVar6[-1].text.d.d = pDVar7;
    pSVar6[-1].text.d.ptr = (args->text).d.ptr;
    pSVar6[-1].text.d.size = (args->text).d.size;
    if (pDVar7 != (Data *)0x0) {
      LOCK();
      (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    iVar11 = args->len;
    pSVar6[-1].start = args->start;
    pSVar6[-1].len = iVar11;
  }
  ppSVar1 = &(this->super_QGenericArrayOps<QCss::Symbol>).super_QArrayDataPointer<QCss::Symbol>.ptr;
  *ppSVar1 = *ppSVar1 + -1;
LAB_005e9063:
  pqVar12 = &(this->super_QGenericArrayOps<QCss::Symbol>).super_QArrayDataPointer<QCss::Symbol>.size
  ;
  *pqVar12 = *pqVar12 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }